

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::AddInitialRange
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Iterator *first,Iterator *last)

{
  S2CellId other;
  int level;
  S2LogMessage local_30;
  S2CellId local_20;
  
  local_30._0_8_ =
       (((first->iter_)._M_t.
         super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
  other.id_ = (((last->iter_)._M_t.
                super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
  if (local_30._0_8_ == other.id_) {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
              (&this->index_covering_,(S2CellId *)&local_30);
    local_30._0_8_ = S2ShapeIndex::Iterator::cell(first);
  }
  else {
    level = S2CellId::GetCommonAncestorLevel((S2CellId *)&local_30,other);
    if (level < 0) {
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x343,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_30.stream_,"Check failed: (level) >= (0) ");
      abort();
    }
    local_20.id_ = (((first->iter_)._M_t.
                     super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_)
                   .id_;
    local_30._0_8_ = S2CellId::parent(&local_20,level);
    std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
              (&this->index_covering_,(S2CellId *)&local_30);
    local_30._0_8_ = (S2ShapeIndexCell *)0x0;
  }
  absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
  emplace_back<S2ShapeIndexCell_const*>
            ((InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *)
             &this->index_cells_,(S2ShapeIndexCell **)&local_30);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::AddInitialRange(
    const S2ShapeIndex::Iterator& first,
    const S2ShapeIndex::Iterator& last) {
  if (first.id() == last.id()) {
    // The range consists of a single index cell.
    index_covering_.push_back(first.id());
    index_cells_.push_back(&first.cell());
  } else {
    // Add the lowest common ancestor of the given range.
    int level = first.id().GetCommonAncestorLevel(last.id());
    S2_DCHECK_GE(level, 0);
    index_covering_.push_back(first.id().parent(level));
    index_cells_.push_back(nullptr);
  }
}